

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O2

float __thiscall
pbrt::MIPMap::EWA<float>(MIPMap *this,int level,Point2f st,Vector2f dst0,Vector2f dst1)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  Point2i PVar6;
  int iVar7;
  int is;
  int iVar8;
  undefined1 auVar9 [16];
  Float FVar10;
  undefined8 in_XMM0_Qb;
  undefined1 auVar11 [64];
  undefined8 in_XMM1_Qb;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined8 in_XMM2_Qb;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_68;
  undefined1 extraout_var [60];
  undefined1 auVar21 [64];
  
  iVar7 = (int)(this->pyramid).nStored;
  if (level < iVar7) {
    PVar6 = LevelResolution(this,level);
    auVar4._8_8_ = in_XMM0_Qb;
    auVar4._0_8_ = st.super_Tuple2<pbrt::Point2,_float>;
    auVar20 = ZEXT816(0) << 0x40;
    auVar21 = ZEXT1664(auVar20);
    auVar12._8_8_ = 0;
    auVar12._0_4_ = PVar6.super_Tuple2<pbrt::Point2,_int>.x;
    auVar12._4_4_ = PVar6.super_Tuple2<pbrt::Point2,_int>.y;
    auVar12 = vcvtdq2ps_avx(auVar12);
    local_98 = dst1.super_Tuple2<pbrt::Vector2,_float>.x;
    fStack_94 = dst1.super_Tuple2<pbrt::Vector2,_float>.y;
    fStack_90 = (float)in_XMM2_Qb;
    fStack_8c = (float)((ulong)in_XMM2_Qb >> 0x20);
    auVar18._0_4_ = auVar12._0_4_ * local_98;
    auVar18._4_4_ = auVar12._4_4_ * fStack_94;
    auVar18._8_4_ = auVar12._8_4_ * fStack_90;
    auVar18._12_4_ = auVar12._12_4_ * fStack_8c;
    local_a8 = dst0.super_Tuple2<pbrt::Vector2,_float>.x;
    fStack_a4 = dst0.super_Tuple2<pbrt::Vector2,_float>.y;
    fStack_a0 = (float)in_XMM1_Qb;
    fStack_9c = (float)((ulong)in_XMM1_Qb >> 0x20);
    auVar16._0_4_ = auVar12._0_4_ * local_a8;
    auVar16._4_4_ = auVar12._4_4_ * fStack_a4;
    auVar16._8_4_ = auVar12._8_4_ * fStack_a0;
    auVar16._12_4_ = auVar12._12_4_ * fStack_9c;
    auVar9 = vmovshdup_avx(auVar12);
    auVar13 = vmovshdup_avx(auVar4);
    auVar2 = vfmadd213ss_fma(auVar12,auVar4,SUB6416(ZEXT464(0xbf000000),0));
    auVar3 = vfmadd213ss_fma(auVar9,auVar13,SUB6416(ZEXT464(0xbf000000),0));
    auVar12 = vmovshdup_avx(auVar18);
    auVar9 = vmovshdup_avx(auVar16);
    auVar12 = vfmadd213ss_fma(auVar9,auVar16,ZEXT416((uint)(auVar18._0_4_ * auVar12._0_4_)));
    fVar1 = auVar12._0_4_ * -2.0;
    auVar13._0_4_ = auVar18._0_4_ * auVar18._0_4_;
    auVar13._4_4_ = auVar18._4_4_ * auVar18._4_4_;
    auVar13._8_4_ = auVar18._8_4_ * auVar18._8_4_;
    auVar13._12_4_ = auVar18._12_4_ * auVar18._12_4_;
    auVar12 = vfmadd231ps_fma(auVar13,auVar16,auVar16);
    auVar9._8_4_ = 0x3f800000;
    auVar9._0_8_ = 0x3f8000003f800000;
    auVar9._12_4_ = 0x3f800000;
    auVar9 = vaddps_avx512vl(auVar12,auVar9);
    auVar12 = vmovshdup_avx(auVar9);
    auVar12 = vfmadd213ss_fma(auVar12,auVar9,ZEXT416((uint)(fVar1 * fVar1 * -0.25)));
    fVar14 = 1.0 / auVar12._0_4_;
    fVar1 = fVar1 * fVar14;
    auVar15._0_4_ = auVar9._0_4_ * fVar14;
    auVar15._4_4_ = auVar9._4_4_ * fVar14;
    auVar15._8_4_ = auVar9._8_4_ * fVar14;
    auVar15._12_4_ = auVar9._12_4_ * fVar14;
    auVar12 = vmovshdup_avx(auVar15);
    fVar19 = auVar12._0_4_;
    auVar12 = vfnmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ * fVar19 * 4.0)),ZEXT416((uint)fVar1),
                               ZEXT416((uint)fVar1));
    fVar14 = auVar12._0_4_;
    auVar12 = vmaxss_avx(ZEXT416((uint)(auVar15._0_4_ * fVar14)),auVar20);
    auVar9 = vsqrtss_avx(auVar12,auVar12);
    auVar12 = vmaxss_avx(ZEXT416((uint)(fVar19 * fVar14)),auVar20);
    fVar14 = 1.0 / fVar14 + 1.0 / fVar14;
    auVar4 = vfnmadd213ss_fma(auVar9,ZEXT416((uint)fVar14),auVar2);
    auVar13 = vfmadd213ss_fma(auVar9,ZEXT416((uint)fVar14),auVar2);
    auVar9 = vroundss_avx(auVar4,auVar4,10);
    auVar4 = vsqrtss_avx(auVar12,auVar12);
    auVar17 = ZEXT864(0) << 0x20;
    auVar12 = vroundss_avx(auVar13,auVar13,9);
    auVar13 = vfnmadd213ss_fma(auVar4,ZEXT416((uint)fVar14),auVar3);
    auVar13 = vroundss_avx(auVar13,auVar13,10);
    auVar4 = vfmadd213ss_fma(auVar4,ZEXT416((uint)fVar14),auVar3);
    iVar7 = (int)auVar13._0_4_;
    auVar13 = vroundss_avx(auVar4,auVar4,9);
    for (; iVar7 <= (int)auVar13._0_4_; iVar7 = iVar7 + 1) {
      local_68 = auVar3._0_4_;
      local_68 = (float)iVar7 - local_68;
      for (iVar8 = (int)auVar9._0_4_; iVar8 <= (int)auVar12._0_4_; iVar8 = iVar8 + 1) {
        fVar14 = (float)iVar8 - auVar2._0_4_;
        auVar4 = vfmadd231ss_fma(ZEXT416((uint)(local_68 * fVar1 * fVar14)),ZEXT416((uint)fVar14),
                                 ZEXT416((uint)(fVar19 * fVar14)));
        auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)(local_68 * auVar15._0_4_)),
                                 ZEXT416((uint)local_68));
        if (auVar4._0_4_ < 1.0) {
          iVar5 = (int)(auVar4._0_4_ * 128.0);
          if (0x7e < iVar5) {
            iVar5 = 0x7f;
          }
          PVar6.super_Tuple2<pbrt::Point2,_int>.y = iVar7;
          PVar6.super_Tuple2<pbrt::Point2,_int>.x = iVar8;
          fVar14 = *(float *)(MIPFilterLUT + (long)iVar5 * 4);
          auVar11._0_4_ = Texel<float>(this,level,PVar6);
          auVar11._4_60_ = extraout_var;
          auVar4 = vfmadd231ss_fma(ZEXT416(auVar17._0_4_),ZEXT416((uint)fVar14),auVar11._0_16_);
          auVar17 = ZEXT1664(auVar4);
          auVar21 = ZEXT464((uint)(auVar21._0_4_ + fVar14));
        }
      }
    }
    return auVar17._0_4_ / auVar21._0_4_;
  }
  FVar10 = Texel<float>(this,iVar7 + -1,(Point2i)0x0);
  return FVar10;
}

Assistant:

T MIPMap::EWA(int level, Point2f st, Vector2f dst0, Vector2f dst1) const {
    if (level >= Levels())
        return Texel<T>(Levels() - 1, {0, 0});
    // Convert EWA coordinates to appropriate scale for level
    Point2i levelRes = LevelResolution(level);
    st[0] = st[0] * levelRes[0] - 0.5f;
    st[1] = st[1] * levelRes[1] - 0.5f;
    dst0[0] *= levelRes[0];
    dst0[1] *= levelRes[1];
    dst1[0] *= levelRes[0];
    dst1[1] *= levelRes[1];

    // Find ellipse coefficients that bound EWA filter region
    Float A = dst0[1] * dst0[1] + dst1[1] * dst1[1] + 1;
    Float B = -2 * (dst0[0] * dst0[1] + dst1[0] * dst1[1]);
    Float C = dst0[0] * dst0[0] + dst1[0] * dst1[0] + 1;
    Float invF = 1 / (A * C - B * B * 0.25f);
    A *= invF;
    B *= invF;
    C *= invF;

    // Compute the ellipse's $(s,t)$ bounding box in texture space
    Float det = -B * B + 4 * A * C;
    Float invDet = 1 / det;
    Float uSqrt = SafeSqrt(det * C), vSqrt = SafeSqrt(A * det);
    int s0 = std::ceil(st[0] - 2 * invDet * uSqrt);
    int s1 = std::floor(st[0] + 2 * invDet * uSqrt);
    int t0 = std::ceil(st[1] - 2 * invDet * vSqrt);
    int t1 = std::floor(st[1] + 2 * invDet * vSqrt);

    // Scan over ellipse bound and evaluate quadratic equation to filter image
    T sum{};
    Float sumWts = 0;
    for (int it = t0; it <= t1; ++it) {
        Float tt = it - st[1];
        for (int is = s0; is <= s1; ++is) {
            Float ss = is - st[0];
            // Compute squared radius and filter texel if it is inside the ellipse
            Float r2 = A * ss * ss + B * ss * tt + C * tt * tt;
            if (r2 < 1) {
                int index = std::min<int>(r2 * MIPFilterLUTSize, MIPFilterLUTSize - 1);
                Float weight = MIPFilterLUT[index];
                sum += weight * Texel<T>(level, {is, it});
                sumWts += weight;
            }
        }
    }
    return sum / sumWts;
}